

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

string * __thiscall
cppcms::widgets::base_text::value_abi_cxx11_(string *__return_storage_ptr__,base_text *this)

{
  pointer pcVar1;
  runtime_error *this_00;
  string local_40;
  
  if (((&this->field_0x1f0)[(long)this->_vptr_base_text[-3]] & 2) != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->value_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->value_)._M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value was not loaded","");
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00284840;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::string base_text::value()
{
	if(!set())
		throw cppcms_error("Value was not loaded");
	return value_;
}